

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O0

bool __thiscall
SGParser::Generator::ParseTableProduction::operator==
          (ParseTableProduction *this,ParseTableProduction *right)

{
  bool bVar1;
  bool local_19;
  ParseTableProduction *right_local;
  ParseTableProduction *this_local;
  
  bVar1 = Production::operator==(this->pProduction,right->pProduction);
  local_19 = false;
  if ((bVar1) && (local_19 = false, this->Dot == right->Dot)) {
    local_19 = std::operator==(&this->LookAhead,&right->LookAhead);
  }
  return local_19;
}

Assistant:

bool ParseTableProduction::operator==(const ParseTableProduction& right) const noexcept {
    return (*pProduction == *right.pProduction) && (Dot == right.Dot) &&
           (LookAhead == right.LookAhead);
}